

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  uchar *puVar1;
  byte bVar2;
  u8 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  KeyInfo *pKVar9;
  MemPage *pMVar10;
  u8 *puVar11;
  u8 *puVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  uchar *pBuf;
  ulong uVar17;
  undefined8 uVar18;
  uint uVar19;
  u32 amt;
  uint uVar20;
  u8 *p;
  uint uVar21;
  bool bVar22;
  i64 nCellKey;
  code *local_80;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\0') && ((pCur->curFlags & 2) != 0)) {
      lVar13 = (pCur->info).nKey;
      if (lVar13 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar13 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_00173f2f;
        if (lVar13 + 1 == intKey) {
          *pRes = 0;
          iVar14 = sqlite3BtreeNext(pCur,0);
          if (iVar14 != 0x65) {
            if (iVar14 != 0) {
              return iVar14;
            }
            getCellInfo(pCur);
            local_80 = (code *)0x0;
            if ((pCur->info).nKey == intKey) {
              return 0;
            }
            goto LAB_00173ae8;
          }
        }
      }
    }
    local_80 = (code *)0x0;
  }
  else {
    pKVar9 = pIdxKey->pKeyInfo;
    local_80 = sqlite3VdbeRecordCompare;
    if (pKVar9->nAllField < 0xe) {
      uVar7 = pIdxKey->aMem->flags;
      bVar22 = *pKVar9->aSortOrder == '\0';
      pIdxKey->r1 = -bVar22 | 1;
      pIdxKey->r2 = -!bVar22 | 1;
      if ((uVar7 & 4) == 0) {
        if (((uVar7 & 0x39) == 0) &&
           (local_80 = sqlite3VdbeRecordCompare, pKVar9->aColl[0] == (CollSeq *)0x0)) {
          local_80 = vdbeRecordCompareString;
        }
      }
      else {
        local_80 = vdbeRecordCompareInt;
      }
    }
    pIdxKey->errCode = '\0';
  }
LAB_00173ae8:
  iVar14 = moveToRoot(pCur);
  if (iVar14 != 0x10) {
    if (iVar14 != 0) {
      return iVar14;
    }
LAB_00173b2f:
    pMVar10 = pCur->pPage;
    uVar7 = pMVar10->nCell;
    iVar14 = uVar7 - 1;
    uVar19 = iVar14 >> (1U - (char)biasRight & 0x1f);
    pCur->ix = (u16)uVar19;
    if (local_80 == (code *)0x0) {
      puVar11 = pMVar10->aDataOfst;
      uVar8 = pMVar10->maskPage;
      puVar12 = pMVar10->aCellIdx;
      uVar3 = pMVar10->intKeyLeaf;
      uVar21 = 0;
      do {
        p = puVar11 + (CONCAT11(puVar12[(long)(int)uVar19 * 2],puVar12[(long)(int)uVar19 * 2 + 1]) &
                      uVar8);
        if (uVar3 != '\0') {
          while ((char)*p < '\0') {
            p = p + 1;
            if (pMVar10->aDataEnd <= p) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c69,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              return 0xb;
            }
          }
          p = p + 1;
        }
        sqlite3GetVarint(p,&local_38);
        uVar20 = uVar19;
        if ((long)local_38 < intKey) {
          uVar21 = uVar19 + 1;
          if (iVar14 <= (int)uVar19) goto LAB_00173d4e;
        }
        else {
          if ((long)local_38 <= intKey) {
            pCur->ix = (u16)uVar19;
            if (pMVar10->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = local_38;
              (pCur->info).nSize = 0;
              *pRes = 0;
              return 0;
            }
            goto LAB_00173d97;
          }
          if ((int)uVar19 <= (int)uVar21) {
            iVar15 = 1;
            uVar19 = uVar21;
            goto LAB_00173d84;
          }
          iVar14 = uVar19 - 1;
        }
        uVar19 = (int)(iVar14 + uVar21) >> 1;
      } while( true );
    }
    uVar21 = 0;
    do {
      puVar11 = pMVar10->aDataOfst;
      uVar17 = (ulong)(CONCAT11(pMVar10->aCellIdx[(long)(int)uVar19 * 2],
                                pMVar10->aCellIdx[(long)(int)uVar19 * 2 + 1]) & pMVar10->maskPage);
      pbVar16 = puVar11 + uVar17 + 1;
      bVar2 = puVar11[uVar17];
      uVar20 = (uint)bVar2;
      if (pMVar10->max1bytePayload < bVar2) {
        if ((-1 < (char)*pbVar16) &&
           (uVar20 = (bVar2 & 0x7f) << 7 | (int)(char)*pbVar16, uVar20 <= pMVar10->maxLocal)) {
          pbVar16 = puVar11 + uVar17 + 2;
          goto LAB_00173c72;
        }
        (*pMVar10->xParseCell)(pMVar10,puVar11 + (uVar17 - pMVar10->childPtrSize),&pCur->info);
        uVar17 = (pCur->info).nKey;
        amt = (u32)uVar17;
        if (((int)amt < 2) ||
           (pCur->pBt->nPage < (uint)((uVar17 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
          uVar18 = 0x10cb4;
LAB_00173ecd:
          iVar15 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar18,
                      "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
        }
        else {
          pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
          if (pBuf == (uchar *)0x0) {
            iVar15 = 7;
          }
          else {
            pCur->ix = (u16)uVar19;
            iVar15 = accessPayload(pCur,0,amt,pBuf,0);
            puVar1 = pBuf + (amt & 0x7fffffff);
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            puVar1[4] = '\0';
            puVar1[5] = '\0';
            puVar1[6] = '\0';
            puVar1[7] = '\0';
            puVar1[8] = '\0';
            puVar1[9] = '\0';
            puVar1[10] = '\0';
            puVar1[0xb] = '\0';
            puVar1[0xc] = '\0';
            puVar1[0xd] = '\0';
            puVar1[0xe] = '\0';
            puVar1[0xf] = '\0';
            (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[0] = '\0';
            (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[1] = '\0';
            pCur->curFlags = pCur->curFlags & 0xfb;
            if (iVar15 == 0) {
              iVar15 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
              sqlite3_free(pBuf);
              goto LAB_00173c7c;
            }
            sqlite3_free(pBuf);
          }
        }
        goto LAB_00173f62;
      }
LAB_00173c72:
      iVar15 = (*local_80)(uVar20,pbVar16,pIdxKey);
LAB_00173c7c:
      if (iVar15 < 0) {
        uVar21 = uVar19 + 1;
      }
      else {
        if (iVar15 == 0) {
          *pRes = 0;
          pCur->ix = (u16)uVar19;
          if (pIdxKey->errCode != '\0') {
            uVar18 = 0x10cd4;
            goto LAB_00173ecd;
          }
          goto LAB_00173f60;
        }
        iVar14 = uVar19 - 1;
      }
      uVar20 = uVar19;
      uVar19 = uVar21;
      if (iVar14 < (int)uVar21) goto LAB_00173d84;
      uVar19 = iVar14 + uVar21 >> 1;
    } while( true );
  }
LAB_00173f2f:
  *pRes = -1;
  return 0;
LAB_00173d4e:
  iVar15 = -1;
  uVar19 = uVar21;
LAB_00173d84:
  if (pMVar10->leaf != '\0') {
    pCur->ix = (u16)uVar20;
    *pRes = iVar15;
LAB_00173f60:
    iVar15 = 0;
    goto LAB_00173f62;
  }
  uVar7 = pMVar10->nCell;
LAB_00173d97:
  if ((int)uVar19 < (int)(uint)uVar7) {
    lVar13 = (ulong)(CONCAT11(pMVar10->aCellIdx[(long)(int)uVar19 * 2],
                              pMVar10->aCellIdx[(long)(int)uVar19 * 2 + 1]) & pMVar10->maskPage) + 3
    ;
  }
  else {
    lVar13 = (ulong)pMVar10->hdrOffset + 0xb;
  }
  pbVar16 = pMVar10->aData + lVar13;
  bVar2 = pbVar16[-3];
  bVar4 = pbVar16[-2];
  bVar5 = pbVar16[-1];
  bVar6 = *pbVar16;
  pCur->ix = (u16)uVar19;
  iVar15 = moveToChild(pCur,(uint)bVar6 |
                            (uint)bVar5 << 8 | (uint)bVar4 << 0x10 | (uint)bVar2 << 0x18);
  if (iVar15 != 0) {
LAB_00173f62:
    (pCur->info).nSize = 0;
    return iVar15;
  }
  goto LAB_00173b2f;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this case, only a little more slowely */
      if( pCur->info.nKey+1==intKey ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, 0);
        if( rc==SQLITE_OK ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }else if( rc==SQLITE_DONE ){
          rc = SQLITE_OK;
        }else{
          return rc;
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->iPage==0 || pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->ix = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ){
              return SQLITE_CORRUPT_PAGE(pPage);
            }
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->ix = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          const int nOverrun = 18;  /* Size of the overrun padding */
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
            rc = SQLITE_CORRUPT_PAGE(pPage);
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+nOverrun );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->ix = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->ix = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}